

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall ParserTest_Unary_Test::TestBody(ParserTest_Unary_Test *this)

{
  __single_object node;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_000003d0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_000003d8;
  string *in_stack_000003e0;
  unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *in_stack_fffffffffffffe18;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffe20;
  unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *this_00;
  unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *in_stack_fffffffffffffe28;
  unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *__u;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_fffffffffffffe30;
  unique_ptr<Node,_std::default_delete<Node>_> *this_01;
  offset_in_Parser_to_subr *in_stack_fffffffffffffe38;
  offset_in_Parser_to_subr *__f;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_fffffffffffffe40;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *this_02;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe58;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  UnaryOperator *in_stack_fffffffffffffe68;
  allocator<char> *__args;
  _Head_base<0UL,_UnaryNode_*,_false> in_stack_fffffffffffffe78;
  undefined8 local_149;
  undefined4 local_11c;
  unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> local_118;
  undefined1 local_110 [16];
  _Manager_type local_100;
  offset_in_Parser_to_subr local_f8 [4];
  allocator<char> local_d1;
  string local_d0 [44];
  undefined4 local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_59;
  string local_58 [52];
  undefined4 local_24;
  undefined4 local_14;
  
  local_14 = 1;
  local_24 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe38);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            (in_stack_fffffffffffffe68,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe60);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            (in_stack_fffffffffffffe20);
  __args = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_98._M_string_length = (size_type)Parser::parseUnary;
  local_98.field_2._M_allocated_capacity = 0;
  __s = (char *)((long)&local_98.field_2 + 8);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  this_03 = &local_98;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<UnaryNode,std::default_delete<UnaryNode>,void>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  setupTest(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffe30);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cade7);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_a4 = 1;
  std::make_unique<VariableNode,char_const(&)[2]>
            ((char (*) [2])in_stack_fffffffffffffe78._M_head_impl);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)__args,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)this_03);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::operator=
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffe20);
  std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
             in_stack_fffffffffffffe20);
  __a = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,__a);
  local_110._8_8_ = Parser::parseUnary;
  local_100 = (_Manager_type)0x0;
  __f = local_f8;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffe40,__f);
  this_02 = (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_110;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<UnaryNode,std::default_delete<UnaryNode>,void>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  setupTest(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffe30);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1caf21);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_11c = 0;
  std::make_unique<VariableNode,char_const(&)[2]>
            ((char (*) [2])in_stack_fffffffffffffe78._M_head_impl);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)__args,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)this_03);
  __u = &local_118;
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::operator=
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffe20);
  std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
             in_stack_fffffffffffffe20);
  this_01 = (unique_ptr<Node,_std::default_delete<Node>_> *)&local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,__a);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (this_02,__f);
  this_00 = (unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)&stack0xfffffffffffffe78;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<UnaryNode,std::default_delete<UnaryNode>,void>(this_01,__u);
  setupTest(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(this_01);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb044);
  std::__cxx11::string::~string((string *)((long)&local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(ParserTest, Unary)
{
  auto node = std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<NumericLiteralNode>(2));
  setupTest("-2", &Parser::parseUnary, std::move(node));

  node = std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<VariableNode>("x"));
  setupTest("-x", &Parser::parseUnary, std::move(node));

  node = std::make_unique<UnaryNode>(UnaryOperator::BinaryNegation, std::make_unique<VariableNode>("x"));
  setupTest("~x", &Parser::parseUnary, std::move(node));
}